

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::AVxFirstPassEncoderThreadTest::~AVxFirstPassEncoderThreadTest
          (AVxFirstPassEncoderThreadTest *this)

{
  anon_unknown.dwarf_7d1152::AVxFirstPassEncoderThreadTest::~AVxFirstPassEncoderThreadTest
            ((AVxFirstPassEncoderThreadTest *)(this + -0x18));
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(encoding_mode_);

    cfg_.g_lag_in_frames = 35;
    cfg_.rc_end_usage = AOM_VBR;
    cfg_.rc_2pass_vbr_minsection_pct = 5;
    cfg_.rc_2pass_vbr_maxsection_pct = 2000;
    cfg_.rc_max_quantizer = 56;
    cfg_.rc_min_quantizer = 0;
  }